

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O0

void __thiscall
helics::apps::Player::addPublication
          (Player *this,string_view name,DataType type,string_view pubUnits)

{
  basic_string_view<char,_std::char_traits<char>_> __str;
  bool bVar1;
  int iVar2;
  int iVar3;
  size_type sVar4;
  size_type sVar5;
  mapped_type *pmVar6;
  element_type *peVar7;
  string *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  InterfaceVisibility *in_RDI;
  basic_string_view<char,_std::char_traits<char>_> localName;
  string *fedName;
  int index;
  string_view keyname;
  size_type kp;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  Interface *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff30;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff38;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff40;
  deque<helics::Publication,_std::allocator<helics::Publication>_> *in_stack_ffffffffffffff50;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
  local_40;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
  local_38 [7];
  
  local_38[0]._M_cur =
       (__node_type *)
       CLI::std::
       unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
       ::find((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
               *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),(key_type *)0x17e537)
  ;
  local_40._M_cur =
       (__node_type *)
       CLI::std::
       unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
       ::end((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
              *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  bVar1 = CLI::std::__detail::operator==(local_38,&local_40);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    if ((in_RDI[0x20] & GLOBAL) == LOCAL) {
      in_stack_ffffffffffffff40 =
           (basic_string_view<char,_std::char_traits<char>_> *)(in_RDI + 0x4e);
      CLI::std::__shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>::get
                ((__shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2> *)
                 (in_RDI + 2));
      std::deque<helics::Publication,std::allocator<helics::Publication>>::
      emplace_back<helics::InterfaceVisibility,helics::CombinationFederate*,std::basic_string_view<char,std::char_traits<char>>&,helics::DataType&,std::basic_string_view<char,std::char_traits<char>>&>
                (in_stack_ffffffffffffff50,in_RDI,(CombinationFederate **)in_stack_ffffffffffffff40,
                 in_stack_ffffffffffffff38,(DataType *)in_stack_ffffffffffffff30,
                 (basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    }
    else {
      sVar4 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                        (in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38,
                         (size_type)in_stack_ffffffffffffff30);
      if (sVar4 == 0xffffffffffffffff) {
        in_stack_ffffffffffffff38 =
             (basic_string_view<char,_std::char_traits<char>_> *)(in_RDI + 0x4e);
        CLI::std::__shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>::get
                  ((__shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2> *)
                   (in_RDI + 2));
        std::deque<helics::Publication,std::allocator<helics::Publication>>::
        emplace_back<helics::CombinationFederate*,std::basic_string_view<char,std::char_traits<char>>&,helics::DataType&,std::basic_string_view<char,std::char_traits<char>>&>
                  ((deque<helics::Publication,_std::allocator<helics::Publication>_> *)
                   in_stack_ffffffffffffff40,(CombinationFederate **)in_stack_ffffffffffffff38,
                   in_stack_ffffffffffffff30,
                   (DataType *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                   (basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff20);
      }
      else {
        in_stack_ffffffffffffff30 =
             (basic_string_view<char,_std::char_traits<char>_> *)(in_RDI + 0x4e);
        CLI::std::__shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>::get
                  ((__shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2> *)
                   (in_RDI + 2));
        std::deque<helics::Publication,std::allocator<helics::Publication>>::
        emplace_back<helics::InterfaceVisibility,helics::CombinationFederate*,std::basic_string_view<char,std::char_traits<char>>&,helics::DataType&,std::basic_string_view<char,std::char_traits<char>>&>
                  (in_stack_ffffffffffffff50,in_RDI,
                   (CombinationFederate **)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                   (DataType *)in_stack_ffffffffffffff30,
                   (basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      }
    }
    CLI::std::deque<helics::Publication,_std::allocator<helics::Publication>_>::back
              ((deque<helics::Publication,_std::allocator<helics::Publication>_> *)
               in_stack_ffffffffffffff30);
    Interface::getName_abi_cxx11_(in_stack_ffffffffffffff20);
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff20);
    sVar5 = CLI::std::deque<helics::Publication,_std::allocator<helics::Publication>_>::size
                      ((deque<helics::Publication,_std::allocator<helics::Publication>_> *)0x17e715)
    ;
    iVar2 = (int)sVar5 + -1;
    iVar3 = iVar2;
    pmVar6 = CLI::std::
             unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
             ::operator[]((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                           *)in_stack_ffffffffffffff20,
                          (key_type *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18))
    ;
    *pmVar6 = iVar3;
    if ((in_RDI[0x20] & GLOBAL) != LOCAL) {
      peVar7 = CLI::std::
               __shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x17e763);
      this_00 = Federate::getName_abi_cxx11_
                          ((Federate *)
                           ((long)&(peVar7->super_ValueFederate)._vptr_ValueFederate +
                           (long)(peVar7->super_ValueFederate)._vptr_ValueFederate[-3]));
      this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::size(this_00);
      std::__cxx11::string::operator_cast_to_basic_string_view(this_01);
      __str._M_str = (char *)in_stack_ffffffffffffff50;
      __str._M_len = (size_t)in_RDI;
      iVar3 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare
                        (in_stack_ffffffffffffff40,(size_type)in_stack_ffffffffffffff38,
                         (size_type)in_stack_ffffffffffffff30,__str);
      if (iVar3 == 0) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                  (this_00);
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::substr
                  (in_stack_ffffffffffffff40,(size_type)in_stack_ffffffffffffff38,
                   (size_type)in_stack_ffffffffffffff30);
        pmVar6 = CLI::std::
                 unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                 ::operator[]((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                               *)this_01,(key_type *)CONCAT44(iVar2,in_stack_ffffffffffffff18));
        *pmVar6 = iVar2;
      }
    }
  }
  else {
    std::operator<<((ostream *)&std::cerr,"publication already exists\n");
  }
  return;
}

Assistant:

void Player::addPublication(std::string_view name, DataType type, std::string_view pubUnits)
{
    // skip already existing publications
    if (pubids.find(name) != pubids.end()) {
        std::cerr << "publication already exists\n";
        return;
    }
    if (!useLocal) {
        publications.emplace_back(
            helics::InterfaceVisibility::GLOBAL, fed.get(), name, type, pubUnits);
    } else {
        auto kp = name.find_first_of("./");
        if (kp == std::string::npos) {
            publications.emplace_back(fed.get(), name, type, pubUnits);
        } else {
            publications.emplace_back(
                helics::InterfaceVisibility::GLOBAL, fed.get(), name, type, pubUnits);
        }
    }
    std::string_view keyname = publications.back().getName();
    auto index = static_cast<int>(publications.size()) - 1;
    pubids[keyname] = index;
    if (useLocal) {
        auto& fedName = fed->getName();
        if (keyname.compare(0, fedName.size(), fedName) == 0) {
            auto localName = keyname.substr(fedName.size() + 1);
            pubids[localName] = index;
        }
    }
}